

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

long __thiscall kws::Parser::GetLineNumber(Parser *this,size_t pos,bool withoutComments)

{
  ulong *puVar1;
  undefined7 in_register_00000011;
  uint uVar2;
  
  if ((int)CONCAT71(in_register_00000011,withoutComments) != 0) {
    pos = GetPositionWithComments(this,pos);
  }
  puVar1 = (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = 0;
  while( true ) {
    if (puVar1 == (this->m_Positions).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      return 0;
    }
    if (pos <= *puVar1) break;
    uVar2 = uVar2 + 1;
    puVar1 = puVar1 + 1;
  }
  return (ulong)uVar2;
}

Assistant:

long int Parser::GetLineNumber(size_t pos,bool withoutComments) const
{

  // if we have comments we add them to the list
  if(withoutComments)
    {
    pos = this->GetPositionWithComments(pos);
    }

  unsigned int i=0;
  auto it = m_Positions.begin();
  while(it != m_Positions.end())
    {
    if(pos<=(*it))
      {
      return i;
      }
    i++;
    it++;
    }
  return 0;
}